

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O2

int main_repl(int argc,char **argv)

{
  program_t *value;
  value_t *pvVar1;
  value_t *pvVar2;
  ostream *poVar3;
  source_t source;
  string local_b8 [32];
  vm_t vm;
  
  deci::vm_t::vm_t(&vm);
  do {
    std::operator<<((ostream *)&std::cout,">> ");
    deci::CompileExpression
              ((source_t *)
               &source.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>,
               "std::cin",(istream *)&std::cin,true);
    value = deci::program_t::Create
                      (source.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)source.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)source.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4);
    pvVar1 = deci::vm_t::Run(&vm,(value_t *)value);
    (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
    pvVar2 = deci::nothing_t::Instance();
    if (pvVar2 != pvVar1) {
      (*pvVar1->_vptr_value_t[4])(local_b8,pvVar1);
      poVar3 = std::operator<<((ostream *)&std::cout,local_b8);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_b8);
    }
    (*pvVar1->_vptr_value_t[3])(pvVar1);
    std::_Vector_base<deci::command_t,_std::allocator<deci::command_t>_>::~_Vector_base
              (&source.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>);
  } while( true );
}

Assistant:

int main_repl(int argc, char* argv[]) {

  deci::vm_t vm;

  while (true) {
    std::cout << ">> ";

    deci::program_t::source_t source = deci::CompileExpression("std::cin", std::cin, true);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
  }

  return 0;
}